

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O0

MallocBlockQueueEntry * __thiscall
FreeQueue<MallocBlockQueueEntry>::Pop
          (MallocBlockQueueEntry *__return_storage_ptr__,FreeQueue<MallocBlockQueueEntry> *this)

{
  int iVar1;
  MallocBlockQueueEntry *ret;
  FreeQueue<MallocBlockQueueEntry> *this_local;
  
  if (this->q_back_ == this->q_front_) {
    syscall(1,2,"Check failed: q_back_ != q_front_: Queue is empty\n",0x32);
    abort();
  }
  iVar1 = this->q_back_;
  this->q_back_ = (this->q_back_ + 1) % 0x400;
  memcpy(__return_storage_ptr__,this->q_ + iVar1,0xa0);
  return __return_storage_ptr__;
}

Assistant:

QueueEntry Pop() {
    RAW_CHECK(q_back_ != q_front_, "Queue is empty");
    const QueueEntry& ret = q_[q_back_];
    q_back_ = (q_back_ + 1) % kFreeQueueSize;
    return ret;
  }